

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O2

void __thiscall MidiPlayerDialog::handlePlaybackFinished(MidiPlayerDialog *this,bool successful)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Master *this_00;
  QSettings *pQVar4;
  QListWidgetItem *pQVar5;
  undefined7 in_register_00000031;
  QFileInfo aQStack_98 [8];
  QArrayDataPointer<char16_t> local_90;
  QVariant local_78;
  QVariant local_58;
  QArrayDataPointer<char16_t> local_38;
  
  QSpinBox::setValue((int)*(undefined8 *)(this->ui + 0xb0));
  if ((int)CONCAT71(in_register_00000031,successful) == 0) {
    this->stopped = true;
  }
  else {
    if (this->stopped == true) {
      this->stopped = false;
      pQVar5 = *(QListWidgetItem **)(this->ui + 0x18);
      QListWidget::row(pQVar5);
      QListWidget::setCurrentRow((int)pQVar5);
    }
    else {
      iVar2 = QListWidget::row(*(QListWidgetItem **)(this->ui + 0x18));
      if (iVar2 == -1) {
LAB_0014ff12:
        this->currentItem = (QListWidgetItem *)0x0;
        iVar2 = QListWidget::count();
        if (0 < iVar2) {
          QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
        }
        this->stopped = true;
        updateCurrentItem(this);
        return;
      }
      iVar3 = QListWidget::count();
      if (iVar3 <= iVar2 + 1) goto LAB_0014ff12;
      QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
      pQVar5 = (QListWidgetItem *)QListWidget::currentItem();
      this->currentItem = pQVar5;
      updateCurrentItem(this);
    }
    QListWidgetItem::text((QString *)&local_38,this->currentItem);
    SMFDriver::start(&this->smfDriver,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    this_00 = Master::getInstance();
    pQVar4 = Master::getSettings(this_00);
    QString::QString((QString *)&local_90,"Master/showConnectionBalloons");
    QVariant::QVariant(&local_78,"1");
    QSettings::value((QString *)&local_58,(QVariant *)pQVar4);
    cVar1 = QVariant::toBool();
    QVariant::~QVariant(&local_58);
    QVariant::~QVariant(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    if (cVar1 != '\0') {
      QString::QString((QString *)&local_58,"Playing MIDI file");
      pQVar5 = (QListWidgetItem *)QListWidget::currentItem();
      QListWidgetItem::text((QString *)&local_90,pQVar5);
      QFileInfo::QFileInfo(aQStack_98,(QString *)&local_90);
      QFileInfo::fileName();
      playbackStarted(this,(QString *)&local_58,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      QFileInfo::~QFileInfo(aQStack_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
  }
  return;
}

Assistant:

void MidiPlayerDialog::handlePlaybackFinished(bool successful) {
	ui->tempoSpinBox->setValue(MidiParser::DEFAULT_BPM);
	if (!successful) {
		stopped = true;
		return;
	}
	if (stopped) {
		stopped = false;
		ui->playList->setCurrentRow(ui->playList->row(currentItem));
	} else {
		int rowPlaying = ui->playList->row(currentItem);
		if (rowPlaying++ == -1 || ui->playList->count() <= rowPlaying) {
			currentItem = NULL;
			if (ui->playList->count() > 0) {
				ui->playList->setCurrentRow(0);
			}
			stopped = true;
			updateCurrentItem();
			return;
		}
		ui->playList->setCurrentRow(rowPlaying);
		currentItem = ui->playList->currentItem();
		updateCurrentItem();
	}
	smfDriver.start(currentItem->text());
	if (Master::getInstance()->getSettings()->value("Master/showConnectionBalloons", "1").toBool()) {
		emit playbackStarted("Playing MIDI file", QFileInfo(ui->playList->currentItem()->text()).fileName());
	}
}